

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomentumHistogram.cpp
# Opt level: O2

ssize_t __thiscall
OpenMD::MomentumHistogram::write(MomentumHistogram *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ostream *poVar2;
  ssize_t sVar3;
  uint uVar4;
  ulong uVar5;
  ofstream rdfStream;
  
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"MomentumHistogram: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&rdfStream,"#");
    poVar2 = std::operator<<(poVar2,(string *)&this->momentumLabel_);
    poVar2 = std::operator<<(poVar2,(string *)&this->componentLabel_);
    std::operator<<(poVar2," distribtution \n");
    poVar2 = std::operator<<((ostream *)&rdfStream,"# nFrames:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->nProcessed_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&rdfStream,"# selection: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript_);
    std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<((ostream *)&rdfStream,"# ");
    poVar2 = std::operator<<(poVar2,"Bin_center");
    std::operator<<(poVar2,"\tcount\n");
    for (uVar4 = 0; uVar5 = (ulong)uVar4,
        uVar5 < (ulong)((long)(this->histList_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->histList_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->bincenter_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar5]);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->histList_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar5]);
      std::operator<<(poVar2,"\n");
    }
  }
  std::ofstream::close();
  sVar3 = std::ofstream::~ofstream(&rdfStream);
  return sVar3;
}

Assistant:

void MomentumHistogram::write() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#" << momentumLabel_ << componentLabel_
                << " distribtution \n";
      rdfStream << "# nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "# selection: (" << selectionScript_ << ")\n";
      rdfStream << "# "
                << "Bin_center"
                << "\tcount\n";
      for (unsigned int i = 0; i < histList_.size(); ++i) {
        rdfStream << bincenter_[i] << "\t" << histList_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MomentumHistogram: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    rdfStream.close();
  }